

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::bt_peer_connection::on_dht_port(bt_peer_connection *this,int received)

{
  crypto_receive_buffer *this_00;
  byte bVar1;
  bool bVar2;
  int iVar3;
  span<const_char> sVar4;
  error_code local_20;
  
  peer_connection::received_bytes(&this->super_peer_connection,0,received);
  this_00 = &this->m_recv_buffer;
  iVar3 = crypto_receive_buffer::packet_size(this_00);
  if (iVar3 == 3) {
    bVar2 = crypto_receive_buffer::packet_finished(this_00);
    if (bVar2) {
      sVar4 = crypto_receive_buffer::get(this_00);
      peer_connection::incoming_dht_port
                (&this->super_peer_connection,
                 (uint)(ushort)(*(ushort *)(sVar4.m_ptr + 1) << 8 |
                               *(ushort *)(sVar4.m_ptr + 1) >> 8));
      bVar1 = (this->super_peer_connection).field_0x889;
      if (((bVar1 & 2) == 0) &&
         ((this->super_peer_connection).field_0x889 = bVar1 | 2, (bVar1 & 8) != 0)) {
        write_dht_port(this);
        return;
      }
    }
  }
  else {
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              (&local_20,invalid_dht_port,(type *)0x0);
    (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
              (this,&local_20,1,2);
  }
  return;
}

Assistant:

void bt_peer_connection::on_dht_port(int received)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(received >= 0);
		received_bytes(0, received);
		if (m_recv_buffer.packet_size() != 3)
		{
			disconnect(errors::invalid_dht_port, operation_t::bittorrent, peer_error);
			return;
		}
		if (!m_recv_buffer.packet_finished()) return;

		span<char const> recv_buffer = m_recv_buffer.get();

		const char* ptr = recv_buffer.data() + 1;
		int const listen_port = aux::read_uint16(ptr);

		incoming_dht_port(listen_port);

		if (!m_supports_dht_port)
		{
			m_supports_dht_port = true;
			// if we're done with the handshake, respond right away, otherwise
			// we'll send the DHT port later
			if (m_sent_bitfield)
				write_dht_port();
		}
	}